

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O3

void Mux_ManFree(Mux_Man_t *p)

{
  Vec_Wec_t *__ptr;
  void *__ptr_00;
  int iVar1;
  Vec_Int_t *__ptr_01;
  long lVar2;
  long lVar3;
  
  Abc_NamStop(p->pNames);
  __ptr = p->vTops;
  iVar1 = __ptr->nCap;
  __ptr_01 = __ptr->pArray;
  if (iVar1 < 1) {
    if (__ptr_01 == (Vec_Int_t *)0x0) {
      free(__ptr);
      goto LAB_00220555;
    }
  }
  else {
    lVar3 = 8;
    lVar2 = 0;
    do {
      __ptr_00 = *(void **)((long)&__ptr_01->nCap + lVar3);
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
        __ptr_01 = __ptr->pArray;
        *(undefined8 *)((long)&__ptr_01->nCap + lVar3) = 0;
        iVar1 = __ptr->nCap;
      }
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar2 < iVar1);
  }
  free(__ptr_01);
  free(__ptr);
  if (p == (Mux_Man_t *)0x0) {
    return;
  }
LAB_00220555:
  free(p);
  return;
}

Assistant:

void Mux_ManFree( Mux_Man_t * p )
{
    Abc_NamStop( p->pNames );
    Vec_WecFree( p->vTops );
    ABC_FREE( p );
}